

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O1

void __thiscall
t_cpp_generator::generate_deserialize_struct
          (t_cpp_generator *this,ostream *out,t_struct *tstruct,string *prefix,bool pointer)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  undefined7 in_register_00000081;
  pointer pptVar4;
  string local_70;
  string local_50;
  
  poVar1 = t_generator::indent((t_generator *)this,out);
  if ((int)CONCAT71(in_register_00000081,pointer) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"xfer += ",8);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    pcVar3 = ".read(iprot);";
    lVar2 = 0xd;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"if (!",5);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") { ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar1 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ::std::shared_ptr<",0x15);
    type_name_abi_cxx11_(&local_50,this,&tstruct->super_t_type,false,false);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,">(new ",6);
    type_name_abi_cxx11_(&local_70,this,&tstruct->super_t_type,false,false);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_70._M_dataplus._M_p,local_70._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,");",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    poVar1 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar1 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"xfer += ",8);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"->read(iprot);",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar1 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"bool wasSet = false;",0x14);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    pptVar4 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pptVar4 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        poVar1 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"if (",4);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar1,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"->__isset.",10);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar1,((*pptVar4)->name_)._M_dataplus._M_p,
                            ((*pptVar4)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,") { wasSet = true; }",0x14);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        pptVar4 = pptVar4 + 1;
      } while (pptVar4 !=
               (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
               .super__Vector_impl_data._M_finish);
    }
    poVar1 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"if (!wasSet) { ",0xf);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    pcVar3 = ".reset(); }";
    lVar2 = 0xb;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,lVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_cpp_generator::generate_deserialize_struct(ostream& out,
                                                  t_struct* tstruct,
                                                  string prefix,
                                                  bool pointer) {
  if (pointer) {
    indent(out) << "if (!" << prefix << ") { " << endl;
    indent(out) << "  " << prefix << " = ::std::shared_ptr<" << type_name(tstruct) << ">(new "
                << type_name(tstruct) << ");" << endl;
    indent(out) << "}" << endl;
    indent(out) << "xfer += " << prefix << "->read(iprot);" << endl;
    indent(out) << "bool wasSet = false;" << endl;
    const vector<t_field*>& members = tstruct->get_members();
    vector<t_field*>::const_iterator f_iter;
    for (f_iter = members.begin(); f_iter != members.end(); ++f_iter) {

      indent(out) << "if (" << prefix << "->__isset." << (*f_iter)->get_name()
                  << ") { wasSet = true; }" << endl;
    }
    indent(out) << "if (!wasSet) { " << prefix << ".reset(); }" << endl;
  } else {
    indent(out) << "xfer += " << prefix << ".read(iprot);" << endl;
  }
}